

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,char delimiter)

{
  char cVar1;
  char cVar2;
  char cVar3;
  pointer pcVar4;
  char *pcVar5;
  pointer pbVar6;
  size_type sVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  long lVar9;
  long lVar10;
  long *plVar11;
  ulong uVar12;
  long *plVar13;
  _Alloc_hider _Var14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  string value;
  string delims;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  value_type local_100;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined1 *local_c0;
  uint local_b4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  pointer local_90;
  ulong local_88;
  char local_80 [16];
  long *local_70;
  char *local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_e0[0] = local_d0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"\'\"`","");
  local_90 = (str->_M_dataplus)._M_p;
  local_100._M_dataplus._M_p = local_90 + str->_M_string_length;
  ::std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
            (&local_c0);
  str->_M_string_length = (long)local_c0 - (long)(str->_M_dataplus)._M_p;
  *local_c0 = 0;
  _Var8 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    ();
  pcVar4 = (str->_M_dataplus)._M_p;
  if (pcVar4 + str->_M_string_length == _Var8._M_current) {
    str->_M_string_length = 0;
    *pcVar4 = '\0';
  }
  else {
    ::std::__cxx11::string::_M_erase((ulong)str,0);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (str->_M_string_length != 0) {
    local_b4 = (uint)(byte)delimiter;
    do {
      lVar9 = ::std::__cxx11::string::find
                        ((char)local_e0,(ulong)(uint)(int)*(str->_M_dataplus)._M_p);
      pcVar5 = (str->_M_dataplus)._M_p;
      if (lVar9 == -1) {
        _Var8 = ::std::
                __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::split_up(std::__cxx11::string,char)::_lambda(char)_1_>>
                          (pcVar5,pcVar5 + str->_M_string_length,local_b4);
        pcVar4 = (str->_M_dataplus)._M_p;
        if (_Var8._M_current == pcVar4 + str->_M_string_length) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,str);
          ::std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x140133);
        }
        else {
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          ::std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)&local_100,pcVar4,_Var8._M_current);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_100);
          local_90 = local_80;
          ::std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)&local_90,_Var8._M_current + 1,
                     (str->_M_dataplus)._M_p + str->_M_string_length);
          ::std::__cxx11::string::operator=((string *)str,(string *)&local_90);
          if (local_90 != local_80) {
            operator_delete(local_90);
          }
          _Var14._M_p = local_100._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
LAB_0013bcbb:
            operator_delete(_Var14._M_p);
          }
        }
      }
      else {
        cVar1 = *pcVar5;
        lVar9 = ::std::__cxx11::string::find((char)str,(ulong)(uint)(int)cVar1);
        if (lVar9 == -1) {
LAB_0013b9a6:
          ::std::__cxx11::string::substr((ulong)&local_100,(ulong)str);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p);
          }
          ::std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x140133);
          if (lVar9 != -1) {
LAB_0013ba76:
            pbVar6 = (__return_storage_ptr__->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            local_b0 = &local_a0;
            pcVar4 = pbVar6[-1]._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,pcVar4,pcVar4 + pbVar6[-1]._M_string_length);
            local_90 = local_80;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\\","");
            plVar11 = (long *)::std::__cxx11::string::_M_replace_aux
                                        ((ulong)&local_90,local_88,0,'\x01');
            local_70 = &local_60;
            plVar13 = plVar11 + 2;
            if ((long *)*plVar11 == plVar13) {
              local_60 = *plVar13;
              lStack_58 = plVar11[3];
            }
            else {
              local_60 = *plVar13;
              local_70 = (long *)*plVar11;
            }
            local_68 = (char *)plVar11[1];
            *plVar11 = (long)plVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            local_50 = local_40;
            ::std::__cxx11::string::_M_construct((ulong)&local_50,'\x01');
            uVar12 = ::std::__cxx11::string::find((char *)&local_b0,(ulong)local_70,0);
            sVar7 = local_a8;
            while (uVar12 != 0xffffffffffffffff) {
              local_a8 = sVar7;
              ::std::__cxx11::string::replace((ulong)&local_b0,uVar12,local_68,(ulong)local_50);
              uVar12 = ::std::__cxx11::string::find
                                 ((char *)&local_b0,(ulong)local_70,uVar12 + local_48);
              sVar7 = local_a8;
            }
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            if (local_b0 != &local_a0) {
              local_100._M_dataplus._M_p = (pointer)local_b0;
            }
            local_100.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
            local_100.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
            local_a8 = 0;
            local_a0._M_local_buf[0] = '\0';
            local_100._M_string_length = sVar7;
            local_b0 = &local_a0;
            ::std::__cxx11::string::operator=
                      ((string *)
                       ((__return_storage_ptr__->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish + -1),(string *)&local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p);
            }
            if (local_50 != local_40) {
              operator_delete(local_50);
            }
            if (local_70 != &local_60) {
              operator_delete(local_70);
            }
            if (local_90 != local_80) {
              operator_delete(local_90);
            }
            _Var14._M_p = (pointer)local_b0;
            if (local_b0 != &local_a0) goto LAB_0013bcbb;
          }
        }
        else {
          cVar2 = (str->_M_dataplus)._M_p[lVar9 + -1];
          cVar3 = cVar2;
          while (cVar3 == '\\') {
            lVar10 = ::std::__cxx11::string::find((char)str,(ulong)(uint)(int)cVar1);
            if (lVar10 == -1) goto LAB_0013b9a6;
            cVar3 = (str->_M_dataplus)._M_p[lVar10 + -1];
          }
          ::std::__cxx11::string::substr((ulong)&local_100,(ulong)str);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p);
          }
          ::std::__cxx11::string::substr((ulong)&local_100,(ulong)str);
          ::std::__cxx11::string::operator=((string *)str,(string *)&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p);
          }
          if (cVar2 == '\\') goto LAB_0013ba76;
        }
      }
      local_90 = (str->_M_dataplus)._M_p;
      local_100._M_dataplus._M_p = local_90 + str->_M_string_length;
      ::std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                (&local_c0,&local_100,&local_90);
      str->_M_string_length = (long)local_c0 - (long)(str->_M_dataplus)._M_p;
      *local_c0 = 0;
      _Var8 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                        ();
      pcVar4 = (str->_M_dataplus)._M_p;
      if (pcVar4 + str->_M_string_length == _Var8._M_current) {
        str->_M_string_length = 0;
        *pcVar4 = '\0';
      }
      else {
        ::std::__cxx11::string::_M_erase((ulong)str,0);
      }
    } while (str->_M_string_length != 0);
  }
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> split_up(std::string str, char delimiter = '\0') {

    const std::string delims("\'\"`");
    auto find_ws = [delimiter](char ch) {
        return (delimiter == '\0') ? (std::isspace<char>(ch, std::locale()) != 0) : (ch == delimiter);
    };
    trim(str);

    std::vector<std::string> output;
    bool embeddedQuote = false;
    char keyChar = ' ';
    while(!str.empty()) {
        if(delims.find_first_of(str[0]) != std::string::npos) {
            keyChar = str[0];
            auto end = str.find_first_of(keyChar, 1);
            while((end != std::string::npos) && (str[end - 1] == '\\')) { // deal with escaped quotes
                end = str.find_first_of(keyChar, end + 1);
                embeddedQuote = true;
            }
            if(end != std::string::npos) {
                output.push_back(str.substr(1, end - 1));
                str = str.substr(end + 1);
            } else {
                output.push_back(str.substr(1));
                str = "";
            }
        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it + 1, str.end());
            } else {
                output.push_back(str);
                str = "";
            }
        }
        // transform any embedded quotes into the regular character
        if(embeddedQuote) {
            output.back() = find_and_replace(output.back(), std::string("\\") + keyChar, std::string(1, keyChar));
            embeddedQuote = false;
        }
        trim(str);
    }
    return output;
}